

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

xmlChar * xmlStrsub(xmlChar *str,int start,int len)

{
  xmlChar *__dest;
  xmlChar *__src;
  long lVar1;
  ulong __n;
  
  if (-1 < (len | start) && str != (xmlChar *)0x0) {
    __src = str;
    if (0 < start) {
      __src = str + (uint)start;
      lVar1 = 0;
      do {
        if (str[lVar1] == '\0') {
          return (xmlChar *)0x0;
        }
        lVar1 = lVar1 + 1;
      } while (start != (int)lVar1);
    }
    if (len < 0) {
      return (xmlChar *)0x0;
    }
    if (*__src == '\0') {
      return (xmlChar *)0x0;
    }
    __n = (ulong)(uint)len;
    __dest = (xmlChar *)(*xmlMalloc)(__n + 1);
    if (__dest != (xmlChar *)0x0) {
      memcpy(__dest,__src,__n);
      __dest[__n] = '\0';
      return __dest;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlStrsub(const xmlChar *str, int start, int len) {
    int i;

    if (str == NULL) return(NULL);
    if (start < 0) return(NULL);
    if (len < 0) return(NULL);

    for (i = 0;i < start;i++) {
        if (*str == 0) return(NULL);
        str++;
    }
    if (*str == 0) return(NULL);
    return(xmlStrndup(str, len));
}